

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O1

void sysbvm_gc_safepoint(sysbvm_context_t *context)

{
  ulong *puVar1;
  ulong in_RAX;
  size_t sVar2;
  ulong uVar3;
  sysbvm_object_tuple_t *objectTuple;
  ulong *pointerAddress;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  ulong local_38;
  
  if (((*(int *)(in_FS_OFFSET + -0x20) == 0) && ((context->heap).shouldAttemptToCollect == true)) &&
     (context->gcDisabled == false)) {
    local_38 = in_RAX;
    sysbvm_gc_iterateRoots(context,context,sysbvm_gc_markPointer);
    sVar2 = (context->markingStack).size;
    while (sVar2 != 0) {
      (context->markingStack).size = sVar2 - 1;
      puVar1 = *(ulong **)((context->markingStack).data + sVar2 * 8 + -8);
      bVar4 = puVar1 == (ulong *)0x0;
      uVar3 = (ulong)puVar1 & 0xf;
      bVar5 = uVar3 != 0;
      if (bVar5 || bVar4) {
        if ((int)uVar3 == 0xf) {
          uVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)puVar1 >> 4);
        }
        else {
          uVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar3);
        }
      }
      else {
        uVar3 = *puVar1;
      }
      local_38 = uVar3;
      sysbvm_gc_markPointer(context,&local_38);
      if ((bVar5 || bVar4) || ((puVar1[1] & 0x300) != 0x200)) {
        if (bVar5 || bVar4) {
          sVar2 = 0;
        }
        else {
          sVar2 = (size_t)(*(uint *)((long)puVar1 + 0xc) >> 3);
          if ((puVar1[1] & 0x300) == 0x100) {
            if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
              sVar2 = sysbvm_type_getTotalSlotCount(uVar3);
            }
            else {
              sVar2 = 0;
            }
          }
        }
        if (sVar2 != 0) {
          pointerAddress = puVar1 + 2;
          do {
            sysbvm_gc_markPointer(context,pointerAddress);
            pointerAddress = pointerAddress + 1;
            sVar2 = sVar2 - 1;
          } while (sVar2 != 0);
        }
      }
      *(uint *)(puVar1 + 1) = (uint)puVar1[1] & 0xfffffffc | (context->heap).gcBlackColor;
      sVar2 = (context->markingStack).size;
    }
    sysbvm_heap_replaceWeakReferencesWithTombstones(&context->heap);
    sysbvm_heap_sweep(&context->heap);
    sysbvm_heap_swapGCColors(&context->heap);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_gc_safepoint(sysbvm_context_t *context)
{
    if(sysbvm_gc_perThreadLockCount != 0)
        return;

    // Check the attempt collection flag on the heap.
    if(!context->heap.shouldAttemptToCollect || context->gcDisabled)
        return;

    // TODO: Add Support for multiple threads.

    // Hook location for validating GC stack roots via GDB scripting.
    sysbvm_gc_debugStackValidationHook();
    sysbvm_gc_performCycle(context);
}